

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_hash_table_based.cpp
# Opt level: O0

void __thiscall
so_5::impl::hash_table_subscr_storage::storage_t::setup_content
          (storage_t *this,subscr_info_vector_t *info)

{
  anon_class_16_2_60363bbb __f;
  iterator __first;
  iterator __last;
  undefined1 local_80 [8];
  hash_table_t fresh_table;
  map_t fresh_map;
  subscr_info_vector_t *info_local;
  storage_t *this_local;
  
  std::
  map<so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
  ::map((map<so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
         *)&fresh_table._M_h._M_single_bucket);
  std::
  unordered_map<const_so_5::impl::hash_table_subscr_storage::key_t_*,_so_5::impl::event_handler_data_t,_so_5::impl::hash_table_subscr_storage::hash_t,_so_5::impl::hash_table_subscr_storage::equal_to_t,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>_>_>
  ::unordered_map((unordered_map<const_so_5::impl::hash_table_subscr_storage::key_t_*,_so_5::impl::event_handler_data_t,_so_5::impl::hash_table_subscr_storage::hash_t,_so_5::impl::hash_table_subscr_storage::equal_to_t,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>_>_>
                   *)local_80);
  __first = std::
            begin<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                      (info);
  __last = std::
           end<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                     (info);
  __f.fresh_table = (hash_table_t *)local_80;
  __f.fresh_map = (map_t *)&fresh_table._M_h._M_single_bucket;
  std::
  for_each<__gnu_cxx::__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>,so_5::impl::hash_table_subscr_storage::storage_t::setup_content(std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>&&)::__0>
            ((__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
              )__first._M_current,
             (__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
              )__last._M_current,__f);
  std::
  map<so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
  ::swap(&this->m_map,
         (map<so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
          *)&fresh_table._M_h._M_single_bucket);
  std::
  unordered_map<const_so_5::impl::hash_table_subscr_storage::key_t_*,_so_5::impl::event_handler_data_t,_so_5::impl::hash_table_subscr_storage::hash_t,_so_5::impl::hash_table_subscr_storage::equal_to_t,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>_>_>
  ::swap(&this->m_hash_table,
         (unordered_map<const_so_5::impl::hash_table_subscr_storage::key_t_*,_so_5::impl::event_handler_data_t,_so_5::impl::hash_table_subscr_storage::hash_t,_so_5::impl::hash_table_subscr_storage::equal_to_t,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>_>_>
          *)local_80);
  std::
  unordered_map<const_so_5::impl::hash_table_subscr_storage::key_t_*,_so_5::impl::event_handler_data_t,_so_5::impl::hash_table_subscr_storage::hash_t,_so_5::impl::hash_table_subscr_storage::equal_to_t,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>_>_>
  ::~unordered_map((unordered_map<const_so_5::impl::hash_table_subscr_storage::key_t_*,_so_5::impl::event_handler_data_t,_so_5::impl::hash_table_subscr_storage::hash_t,_so_5::impl::hash_table_subscr_storage::equal_to_t,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>_>_>
                    *)local_80);
  std::
  map<so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
  ::~map((map<so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
          *)&fresh_table._M_h._M_single_bucket);
  return;
}

Assistant:

void
storage_t::setup_content(
	subscription_storage_common::subscr_info_vector_t && info )
	{
		using namespace std;
		using namespace subscription_storage_common;

		map_t fresh_map;
		hash_table_t fresh_table;

		for_each( begin(info), end(info),
			[&]( const subscr_info_t & i )
			{
				key_t k{ i.m_mbox->id(), i.m_msg_type, *(i.m_state) };

				auto ins_result = fresh_map.emplace( k, i.m_mbox );

				fresh_table.emplace( &(ins_result.first->first), i.m_handler );
			} );

		m_map.swap( fresh_map );
		m_hash_table.swap( fresh_table );
	}